

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5SnippetFunction(Fts5ExtensionApi *pApi,Fts5Context *pFts,sqlite3_context *pCtx,int nVal,
                        sqlite3_value **apVal)

{
  long lVar1;
  uchar *aSeen;
  int iVar2;
  i64 iVar3;
  char *z;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint iCol;
  bool bVar10;
  int ip;
  uint local_134;
  Fts5ExtensionApi *local_130;
  Fts5Context *local_128;
  int nDocsize;
  int local_11c;
  int nColSize;
  int local_114;
  int local_110;
  int io;
  int nInst;
  uint local_104;
  ulong local_100;
  uchar *local_f8;
  i64 local_f0;
  int iAdj;
  int ic;
  int nDoc;
  Fts5SFinder sFinder;
  HighlightContext ctx;
  
  nInst = 0;
  nColSize = 0;
  local_130 = pApi;
  local_128 = pFts;
  if (nVal != 5) {
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr
              (pCtx->pOut,"wrong number of arguments to function snippet()",-1,'\x01',
               (_func_void_void_ptr *)0xffffffffffffffff);
    return;
  }
  local_104 = (*pApi->xColumnCount)(pFts);
  ctx.iter.pApi = (Fts5ExtensionApi *)0x0;
  ctx.iter.pFts = (Fts5Context *)0x0;
  ctx.iter.iCol = 0;
  ctx.iter.iInst = 0;
  ctx.iter.nInst = 0;
  ctx.iter.iStart = 0;
  ctx.iter.iEnd = 0;
  ctx.iter._36_4_ = 0;
  ctx.iPos = 0;
  ctx.iRangeStart = 0;
  ctx.iRangeEnd = 0;
  ctx._52_4_ = 0;
  ctx.zOpen = (char *)0x0;
  ctx.zClose = (char *)0x0;
  ctx.zIn = (char *)0x0;
  ctx.nIn = 0;
  ctx.iOff = 0;
  ctx.zOut = (char *)0x0;
  iVar3 = sqlite3VdbeIntValue(*apVal);
  ctx.zOpen = (char *)sqlite3ValueText(apVal[1],'\x01');
  if (ctx.zOpen == (char *)0x0) {
    ctx.zOpen = "";
  }
  ctx.zClose = (char *)sqlite3ValueText(apVal[2],'\x01');
  if (ctx.zClose == (char *)0x0) {
    ctx.zClose = "";
  }
  z = (char *)sqlite3ValueText(apVal[3],'\x01');
  if (z == (char *)0x0) {
    z = "";
  }
  local_f0 = sqlite3VdbeIntValue(apVal[4]);
  uVar6 = (uint)iVar3;
  local_134 = 0;
  if (0 < (int)uVar6) {
    local_134 = uVar6;
  }
  iVar2 = (*pApi->xPhraseCount)(pFts);
  local_f8 = (uchar *)sqlite3_malloc(iVar2);
  if (local_f8 == (uchar *)0x0) {
    ip = 7;
  }
  else {
    ip = (*local_130->xInstCount)(local_128,&nInst);
  }
  sFinder.aFirst = (int *)0x0;
  sFinder.zDoc = (char *)0x0;
  sFinder.iPos = 0;
  sFinder.nFirstAlloc = 0;
  sFinder.nFirst = 0;
  sFinder._12_4_ = 0;
  if ((int)local_104 < 1) {
    local_100 = 0;
    bVar10 = true;
  }
  else {
    local_114 = 0;
    iCol = 0;
    local_11c = 0;
    local_100 = 0;
    do {
      if ((int)uVar6 < 0 || iCol == uVar6) {
        sFinder._0_8_ = sFinder._0_8_ & 0xffffffff00000000;
        sFinder._8_8_ = sFinder._8_8_ & 0xffffffff00000000;
        ip = (*local_130->xColumnText)(local_128,iCol,&sFinder.zDoc,&nDoc);
        uVar8 = local_134;
        if (((ip != 0) ||
            (ip = (*local_130->xTokenize)(local_128,sFinder.zDoc,nDoc,&sFinder,fts5SentenceFinderCb)
            , uVar8 = local_134, ip != 0)) ||
           (ip = (*local_130->xColumnSize)(local_128,iCol,&nDocsize), uVar8 = local_134, ip != 0))
        goto LAB_001afb8c;
        if (0 < nInst) {
          iVar7 = 0;
          do {
            ip = (*local_130->xInst)(local_128,iVar7,&ip,&ic,&io);
            aSeen = local_f8;
            if (ic == iCol) {
              if (nDocsize < io) {
                ip = 0x10b;
                goto LAB_001afb00;
              }
              if (ip != 0) goto LAB_001afb00;
              memset(local_f8,0,(long)iVar2);
              ip = fts5SnippetScore(local_130,local_128,nDocsize,aSeen,iCol,io,(int)local_f0,
                                    &local_110,&iAdj);
              if (ip != 0) goto LAB_001afb00;
              if (local_11c < local_110) {
                local_100 = (ulong)(uint)iAdj;
                nColSize = nDocsize;
                local_114 = nDocsize;
                local_11c = local_110;
                local_134 = iCol;
              }
              ip = 0;
              if ((int)local_f0 < nDocsize && sFinder.nFirst != 0) {
                iVar4 = sFinder.nFirst;
                if (sFinder.nFirst < 2) {
                  iVar4 = 1;
                }
                uVar9 = 0xffffffffffffffff;
                do {
                  uVar5 = (ulong)(iVar4 - 1);
                  if (uVar9 - (iVar4 - 1) == -1) break;
                  uVar5 = uVar9 + 1;
                  lVar1 = uVar9 + 2;
                  uVar9 = uVar5;
                } while (sFinder.aFirst[lVar1] <= io);
                if (sFinder.aFirst[uVar5] < io) {
                  memset(local_f8,0,(long)iVar2);
                  ip = fts5SnippetScore(local_130,local_128,nDocsize,local_f8,iCol,
                                        sFinder.aFirst[uVar5],(int)local_f0,&local_110,(int *)0x0);
                  iVar4 = 100;
                  if (sFinder.aFirst[uVar5] == 0) {
                    iVar4 = 0x78;
                  }
                  if ((ip == 0) && (local_11c < iVar4 + local_110)) {
                    local_114 = nDocsize;
                    nColSize = nDocsize;
                    ip = 0;
                    local_134 = iCol;
                    local_11c = iVar4 + local_110;
                    local_100 = (ulong)(uint)sFinder.aFirst[uVar5];
                  }
                }
              }
            }
            if ((ip != 0) || (iVar7 = iVar7 + 1, nInst <= iVar7)) goto LAB_001afb00;
          } while( true );
        }
        ip = 0;
      }
LAB_001afb00:
      iCol = iCol + 1;
    } while (iCol != local_104);
    bVar10 = local_114 == 0;
  }
  uVar8 = local_134;
  if ((ip == 0) &&
     (ip = (*local_130->xColumnText)(local_128,local_134,&ctx.zIn,&ctx.nIn),
     (bool)(ip == 0 & bVar10))) {
    ip = (*local_130->xColumnSize)(local_128,uVar8,&nColSize);
  }
LAB_001afb8c:
  if (ctx.zIn != (char *)0x0) {
    iVar2 = ip;
    if (ip == 0) {
      ctx.iter.nInst = 0;
      ctx.iter.iStart = 0;
      ctx.iter.iEnd = 0;
      ctx.iter._36_4_ = 0;
      ctx.iter.pApi = local_130;
      ctx.iter.pFts = local_128;
      ctx.iter.iInst = 0;
      ctx.iter.iCol = uVar8;
      iVar2 = (*local_130->xInstCount)(local_128,&ctx.iter.nInst);
      if (iVar2 == 0) {
        iVar2 = fts5CInstIterNext(&ctx.iter);
      }
    }
    ip = iVar2;
    iVar2 = (int)local_100;
    ctx.iRangeStart = iVar2;
    ctx.iRangeEnd = (int)local_f0 + iVar2 + -1;
    if (0 < iVar2) {
      fts5HighlightAppend(&ip,&ctx,z,-1);
    }
    iVar7 = ip;
    if (-1 < (long)ctx.iter._24_8_) {
      do {
        if ((iVar2 <= ctx.iter.iStart) || (iVar7 != 0)) break;
        iVar7 = fts5CInstIterNext(&ctx.iter);
      } while (-1 < (long)ctx.iter._24_8_);
    }
    ip = iVar7;
    if (iVar7 == 0) {
      ip = (*local_130->xTokenize)(local_128,ctx.zIn,ctx.nIn,&ctx,fts5HighlightCb);
    }
    if (ctx.iRangeEnd < nColSize + -1) {
      iVar2 = -1;
    }
    else {
      iVar2 = ctx.nIn - ctx.iOff;
      z = ctx.zIn + ctx.iOff;
    }
    fts5HighlightAppend(&ip,&ctx,z,iVar2);
  }
  if (ip == 0) {
    setResultStrOrError(pCtx,ctx.zOut,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  }
  else {
    sqlite3_result_error_code(pCtx,ip);
  }
  sqlite3_free(ctx.zOut);
  sqlite3_free(local_f8);
  sqlite3_free(sFinder.aFirst);
  return;
}

Assistant:

static void fts5SnippetFunction(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  sqlite3_context *pCtx,          /* Context for returning result/error */
  int nVal,                       /* Number of values in apVal[] array */
  sqlite3_value **apVal           /* Array of trailing arguments */
){
  HighlightContext ctx;
  int rc = SQLITE_OK;             /* Return code */
  int iCol;                       /* 1st argument to snippet() */
  const char *zEllips;            /* 4th argument to snippet() */
  int nToken;                     /* 5th argument to snippet() */
  int nInst = 0;                  /* Number of instance matches this row */
  int i;                          /* Used to iterate through instances */
  int nPhrase;                    /* Number of phrases in query */
  unsigned char *aSeen;           /* Array of "seen instance" flags */
  int iBestCol;                   /* Column containing best snippet */
  int iBestStart = 0;             /* First token of best snippet */
  int nBestScore = 0;             /* Score of best snippet */
  int nColSize = 0;               /* Total size of iBestCol in tokens */
  Fts5SFinder sFinder;            /* Used to find the beginnings of sentences */
  int nCol;

  if( nVal!=5 ){
    const char *zErr = "wrong number of arguments to function snippet()";
    sqlite3_result_error(pCtx, zErr, -1);
    return;
  }

  nCol = pApi->xColumnCount(pFts);
  memset(&ctx, 0, sizeof(HighlightContext));
  iCol = sqlite3_value_int(apVal[0]);
  ctx.zOpen = fts5ValueToText(apVal[1]);
  ctx.zClose = fts5ValueToText(apVal[2]);
  zEllips = fts5ValueToText(apVal[3]);
  nToken = sqlite3_value_int(apVal[4]);

  iBestCol = (iCol>=0 ? iCol : 0);
  nPhrase = pApi->xPhraseCount(pFts);
  aSeen = sqlite3_malloc(nPhrase);
  if( aSeen==0 ){
    rc = SQLITE_NOMEM;
  }
  if( rc==SQLITE_OK ){
    rc = pApi->xInstCount(pFts, &nInst);
  }

  memset(&sFinder, 0, sizeof(Fts5SFinder));
  for(i=0; i<nCol; i++){
    if( iCol<0 || iCol==i ){
      int nDoc;
      int nDocsize;
      int ii;
      sFinder.iPos = 0;
      sFinder.nFirst = 0;
      rc = pApi->xColumnText(pFts, i, &sFinder.zDoc, &nDoc);
      if( rc!=SQLITE_OK ) break;
      rc = pApi->xTokenize(pFts, 
          sFinder.zDoc, nDoc, (void*)&sFinder,fts5SentenceFinderCb
      );
      if( rc!=SQLITE_OK ) break;
      rc = pApi->xColumnSize(pFts, i, &nDocsize);
      if( rc!=SQLITE_OK ) break;

      for(ii=0; rc==SQLITE_OK && ii<nInst; ii++){
        int ip, ic, io;
        int iAdj;
        int nScore;
        int jj;

        rc = pApi->xInst(pFts, ii, &ip, &ic, &io);
        if( ic!=i ) continue;
        if( io>nDocsize ) rc = FTS5_CORRUPT;
        if( rc!=SQLITE_OK ) continue;
        memset(aSeen, 0, nPhrase);
        rc = fts5SnippetScore(pApi, pFts, nDocsize, aSeen, i,
            io, nToken, &nScore, &iAdj
        );
        if( rc==SQLITE_OK && nScore>nBestScore ){
          nBestScore = nScore;
          iBestCol = i;
          iBestStart = iAdj;
          nColSize = nDocsize;
        }

        if( rc==SQLITE_OK && sFinder.nFirst && nDocsize>nToken ){
          for(jj=0; jj<(sFinder.nFirst-1); jj++){
            if( sFinder.aFirst[jj+1]>io ) break;
          }

          if( sFinder.aFirst[jj]<io ){
            memset(aSeen, 0, nPhrase);
            rc = fts5SnippetScore(pApi, pFts, nDocsize, aSeen, i, 
              sFinder.aFirst[jj], nToken, &nScore, 0
            );

            nScore += (sFinder.aFirst[jj]==0 ? 120 : 100);
            if( rc==SQLITE_OK && nScore>nBestScore ){
              nBestScore = nScore;
              iBestCol = i;
              iBestStart = sFinder.aFirst[jj];
              nColSize = nDocsize;
            }
          }
        }
      }
    }
  }

  if( rc==SQLITE_OK ){
    rc = pApi->xColumnText(pFts, iBestCol, &ctx.zIn, &ctx.nIn);
  }
  if( rc==SQLITE_OK && nColSize==0 ){
    rc = pApi->xColumnSize(pFts, iBestCol, &nColSize);
  }
  if( ctx.zIn ){
    if( rc==SQLITE_OK ){
      rc = fts5CInstIterInit(pApi, pFts, iBestCol, &ctx.iter);
    }

    ctx.iRangeStart = iBestStart;
    ctx.iRangeEnd = iBestStart + nToken - 1;

    if( iBestStart>0 ){
      fts5HighlightAppend(&rc, &ctx, zEllips, -1);
    }

    /* Advance iterator ctx.iter so that it points to the first coalesced
    ** phrase instance at or following position iBestStart. */
    while( ctx.iter.iStart>=0 && ctx.iter.iStart<iBestStart && rc==SQLITE_OK ){
      rc = fts5CInstIterNext(&ctx.iter);
    }

    if( rc==SQLITE_OK ){
      rc = pApi->xTokenize(pFts, ctx.zIn, ctx.nIn, (void*)&ctx,fts5HighlightCb);
    }
    if( ctx.iRangeEnd>=(nColSize-1) ){
      fts5HighlightAppend(&rc, &ctx, &ctx.zIn[ctx.iOff], ctx.nIn - ctx.iOff);
    }else{
      fts5HighlightAppend(&rc, &ctx, zEllips, -1);
    }
  }
  if( rc==SQLITE_OK ){
    sqlite3_result_text(pCtx, (const char*)ctx.zOut, -1, SQLITE_TRANSIENT);
  }else{
    sqlite3_result_error_code(pCtx, rc);
  }
  sqlite3_free(ctx.zOut);
  sqlite3_free(aSeen);
  sqlite3_free(sFinder.aFirst);
}